

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool GetParsePickListValue(TidyDocImpl *doc,TidyOptionImpl *entry,uint *result)

{
  Bool BVar1;
  bool bVar2;
  tmbstr end;
  tmbstr cp;
  tmbchar work [16];
  tchar c;
  TidyConfigImpl *cfg;
  uint *result_local;
  TidyOptionImpl *entry_local;
  TidyDocImpl *doc_local;
  
  work._12_4_ = SkipWhite(&doc->config);
  memset(&cp,0,0x10);
  end = (tmbstr)&cp;
  while( true ) {
    bVar2 = false;
    if ((work._12_4_ != -1) && (bVar2 = false, end < work + 8)) {
      BVar1 = prvTidyIsWhite(work._12_4_);
      bVar2 = false;
      if ((BVar1 == no) && (bVar2 = false, work._12_4_ != 0xd)) {
        bVar2 = work._12_4_ != 10;
      }
    }
    if (!bVar2) break;
    *end = (tmbchar)work._12_4_;
    work._12_4_ = AdvanceChar(&doc->config);
    end = end + 1;
  }
  BVar1 = GetPickListValue((ctmbstr)&cp,entry->pickList,result);
  if (BVar1 != yes) {
    prvTidyReportBadArgument(doc,entry->name);
  }
  doc_local._4_4_ = (Bool)(BVar1 == yes);
  return doc_local._4_4_;
}

Assistant:

static Bool GetParsePickListValue( TidyDocImpl* doc, const TidyOptionImpl* entry, uint *result )
{
    TidyConfigImpl* cfg = &doc->config;
    tchar c = SkipWhite( cfg );
    tmbchar work[ 16 ] = {0};
    tmbstr cp = work, end = work + sizeof(work);

    while ( c!=EndOfStream && cp < end && !TY_(IsWhite)(c) && c != '\r' && c != '\n' )
    {
        *cp++ = (tmbchar) c;
        c = AdvanceChar( cfg );
    }

    if ( GetPickListValue( work, entry->pickList, result ) != yes )
    {
        TY_(ReportBadArgument)( doc, entry->name );
        return no;
    }

    return yes;
}